

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.cpp
# Opt level: O2

int __thiscall
QMessageDialogOptions::clone
          (QMessageDialogOptions *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  totally_ordered_wrapper<(anonymous_namespace)::MessageDialogCombined_*> tVar1;
  ExternalRefCountData *pEVar2;
  long in_FS_OFFSET;
  QSharedPointer<(anonymous_namespace)::MessageDialogCombined> result;
  QSharedPointer<(anonymous_namespace)::MessageDialogCombined> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.value.ptr = (MessageDialogCombined *)&DAT_aaaaaaaaaaaaaaaa;
  pEVar2 = QtSharedPointer::
           ExternalRefCountWithContiguousData<(anonymous_namespace)::MessageDialogCombined>::create
                     ((NoCVType **)&local_48,(DestroyerFn)__fn);
  tVar1.ptr = local_48.value.ptr;
  QMessageDialogOptionsPrivate::QMessageDialogOptionsPrivate
            (&(local_48.value.ptr)->super_QMessageDialogOptionsPrivate,
             (QMessageDialogOptionsPrivate *)(__fn + -0xd0));
  ((tVar1.ptr)->super_QMessageDialogOptions).d = &(tVar1.ptr)->super_QMessageDialogOptionsPrivate;
  pEVar2->destroyer =
       QtSharedPointer::
       ExternalRefCountWithContiguousData<(anonymous_namespace)::MessageDialogCombined>::deleter;
  *(QMessageDialogOptions **)this = &(tVar1.ptr)->super_QMessageDialogOptions;
  *(ExternalRefCountData **)(this + 8) = pEVar2;
  local_48.value.ptr = (MessageDialogCombined *)0x0;
  local_48.d = (Data *)0x0;
  QSharedPointer<(anonymous_namespace)::MessageDialogCombined>::~QSharedPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QSharedPointer<QMessageDialogOptions> QMessageDialogOptions::clone() const
{
    return QSharedPointer<MessageDialogCombined>::create(*static_cast<const MessageDialogCombined*>(this));
}